

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::LDA_ZP(CPU *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  this->cycles = 3;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 2;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uVar2 & 0xff));
  bVar1 = (byte)iVar3;
  this->A = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::LDA_ZP()
{
    cycles = 3;
    A = ReadByte(GetByte());
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}